

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::SkelAnimation>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,SkelAnimation *anim,string *prop_name,Property *out_prop)

{
  size_type *psVar1;
  pointer pcVar2;
  pointer pcVar3;
  double t;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *pvVar7;
  string *err_00;
  string *err_01;
  string *err_02;
  ulong uVar8;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long lVar9;
  PrimVar pvar;
  Value val;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> a;
  string err;
  Attribute attr;
  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
  aval;
  storage_union local_968;
  undefined1 local_958 [32];
  undefined1 uStack_938;
  undefined8 uStack_937;
  storage_union local_920;
  undefined **local_910;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_908;
  undefined1 local_8f8;
  undefined7 uStack_8f7;
  undefined1 local_8f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e8;
  string local_8d8;
  undefined1 local_8b8 [40];
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  undefined1 local_610 [8];
  undefined1 local_608 [32];
  TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
  local_5e8;
  any local_5c8;
  bool local_5b0;
  pointer local_5a8;
  pointer local_5a0;
  pointer local_598;
  bool local_590;
  pointer local_588;
  pointer local_580;
  pointer local_578;
  AttrMetas AStack_570;
  ListEditQual local_368;
  Type TStack_364;
  Type local_360;
  Path PStack_358;
  pointer local_288;
  pointer local_280;
  pointer local_278;
  ListEditQual local_270;
  AttrMetas AStack_268;
  bool local_60;
  string asStack_58 [32];
  bool local_38;
  
  if (out_prop == (Property *)0x0) {
    local_610 = (undefined1  [8])0x40b52f;
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)local_610);
    return __return_storage_ptr__;
  }
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  local_8d8._M_string_length = 0;
  local_8d8.field_2._M_local_buf[0] = '\0';
  iVar5 = ::std::__cxx11::string::compare((char *)prop_name);
  if (iVar5 == 0) {
    bVar4 = (anonymous_namespace)::
            ToProperty<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                      (&anim->blendShapes,out_prop,&local_8d8);
    if (!bVar4) {
      local_968.dynamic = local_958;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_968,"Convert Property {} failed: {}\n","");
      fmt::format<char[12],std::__cxx11::string>
                ((string *)local_8b8,(fmt *)&local_968,(string *)0x3ff8a0,(char (*) [12])&local_8d8,
                 in_R8);
LAB_00329048:
      pcVar2 = local_608 + 8;
      pcVar3 = local_8b8 + 0x10;
      if ((pointer)local_8b8._0_8_ == pcVar3) {
        local_608._16_8_ = local_8b8._24_8_;
        local_610 = (undefined1  [8])pcVar2;
      }
      else {
        local_610 = (undefined1  [8])local_8b8._0_8_;
      }
      local_608._9_7_ = local_8b8._17_7_;
      local_608[8] = local_8b8[0x10];
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = false;
      psVar1 = (size_type *)
               ((long)&(__return_storage_ptr__->contained).
                       super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0 + 0x10);
      *(size_type **)
       &(__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 = psVar1;
      if (local_610 == (undefined1  [8])pcVar2) {
        *psVar1 = local_608._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->contained).
                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0 + 0x18) = local_608._16_8_;
      }
      else {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_dataplus._M_p = (pointer)local_610;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->contained).
                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0 + 0x10) = local_608._8_8_;
      }
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_string_length = local_8b8._8_8_;
      local_608._8_8_ = (ulong)(uint7)local_8b8._17_7_ << 8;
      local_608._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_8b8[0x10] = '\0';
      local_8b8._8_8_ = 0;
      local_8b8._0_8_ = pcVar3;
      local_610 = (undefined1  [8])pcVar2;
      if ((pointer)local_968.dynamic != (pointer)local_958) {
        operator_delete(local_968.dynamic,(ulong)(local_958._0_8_ + 1));
      }
      goto LAB_0032994a;
    }
  }
  else {
    iVar5 = ::std::__cxx11::string::compare((char *)prop_name);
    if (iVar5 == 0) {
      (anonymous_namespace)::ToProperty<std::vector<float,std::allocator<float>>>
                (&anim->blendShapeWeights,out_prop,err_00);
    }
    else {
      iVar5 = ::std::__cxx11::string::compare((char *)prop_name);
      if (iVar5 == 0) {
        bVar4 = (anonymous_namespace)::
                ToProperty<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                          (&anim->joints,out_prop,&local_8d8);
        if (!bVar4) {
          local_968.dynamic = local_958;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_968,"Convert Property {} failed: {}\n","");
          fmt::format<char[7],std::__cxx11::string>
                    ((string *)local_8b8,(fmt *)&local_968,(string *)"joints",
                     (char (*) [7])&local_8d8,in_R8);
          goto LAB_00329048;
        }
      }
      else {
        iVar5 = ::std::__cxx11::string::compare((char *)prop_name);
        if (iVar5 == 0) {
          local_8b8._0_8_ = local_8b8 + 0x10;
          local_8b8._8_8_ = 0;
          local_8b8[0x10] = '\0';
          local_8b8[0x24] = 0;
          local_890._M_p = (pointer)&local_880;
          local_888 = 0;
          local_880._M_local_buf[0] = '\0';
          local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_870.dynamic = (void *)0x0;
          local_858 = false;
          local_850._0_8_ = (pointer)0x0;
          local_850[8] = 0;
          local_850._9_7_ = 0;
          local_850[0x10] = 0;
          local_850._17_8_ = 0;
          AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
          AStack_818.elementSize.has_value_ = false;
          AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
          AStack_818.hidden.has_value_ = false;
          AStack_818.hidden.contained = (storage_t<bool>)0x0;
          AStack_818.comment.has_value_ = false;
          AStack_818.weight.contained = (storage_t<double>)0x0;
          AStack_818.connectability.has_value_ = false;
          AStack_818.bindMaterialAs.contained._16_8_ = 0;
          AStack_818.bindMaterialAs.contained._24_8_ = 0;
          AStack_818.bindMaterialAs.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.bindMaterialAs.contained._8_8_ = 0;
          AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
          AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.comment.contained._8_8_ = 0;
          AStack_818.comment.contained._16_8_ = 0;
          AStack_818.comment.contained._24_8_ = 0;
          AStack_818.comment.contained._32_8_ = 0;
          AStack_818.comment.contained._40_8_ = 0;
          AStack_818.customData.has_value_ = false;
          AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.customData.contained._8_8_ = 0;
          AStack_818.customData.contained._16_8_ = 0;
          AStack_818.customData.contained._24_8_ = 0;
          AStack_818.customData.contained._32_8_ = 0;
          AStack_818.customData.contained._40_8_ = 0;
          AStack_818.weight.has_value_ = false;
          AStack_818.connectability.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.connectability.contained._8_8_ = 0;
          AStack_818.connectability.contained._16_8_ = 0;
          AStack_818.connectability.contained._24_8_ = 0;
          AStack_818.outputName.has_value_ = false;
          AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.outputName.contained._8_8_ = 0;
          AStack_818.outputName.contained._16_8_ = 0;
          AStack_818.outputName.contained._24_8_ = 0;
          AStack_818.renderType.has_value_ = false;
          AStack_818.sdrMetadata.has_value_ = false;
          AStack_818.renderType.contained._16_8_ = 0;
          AStack_818.renderType.contained._24_8_ = 0;
          AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.renderType.contained._8_8_ = 0;
          AStack_818.displayName.has_value_ = false;
          AStack_818.sdrMetadata.contained._32_8_ = 0;
          AStack_818.sdrMetadata.contained._40_8_ = 0;
          AStack_818.sdrMetadata.contained._16_8_ = 0;
          AStack_818.sdrMetadata.contained._24_8_ = 0;
          AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.sdrMetadata.contained._8_8_ = 0;
          AStack_818.displayGroup.has_value_ = false;
          AStack_818.displayName.contained._16_8_ = 0;
          AStack_818.displayName.contained._24_8_ = 0;
          AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.displayName.contained._8_8_ = 0;
          AStack_818.bindMaterialAs.has_value_ = false;
          AStack_818.displayGroup.contained._16_8_ = 0;
          AStack_818.displayGroup.contained._24_8_ = 0;
          AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
          ;
          AStack_818.displayGroup.contained._8_8_ = 0;
          local_830[0x10] = 0;
          stack0xfffffffffffff7e1 = 0;
          local_830._0_8_ = (pointer)0x0;
          local_830[8] = 0;
          local_830._9_7_ = 0;
          AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          AStack_818.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          AStack_818.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          AStack_818.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_8b8._32_4_ = Varying;
          AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          tinyusdz::value::
          TypeTraits<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>::
          type_name_abi_cxx11_();
          ::std::__cxx11::string::_M_assign((string *)&local_890);
          if (local_610 != (undefined1  [8])(local_608 + 8)) {
            operator_delete((void *)local_610,local_608._8_8_ + 1);
          }
          if ((anim->rotations)._blocked == true) {
            local_858 = true;
          }
          if ((anim->rotations)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (anim->rotations)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start) {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(anim->rotations)._paths);
          }
          local_958._0_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_968.dynamic = (void *)0x0;
          local_958[8] = 0;
          local_958._16_8_ = 0;
          local_958[0x18] = '\0';
          local_958._25_7_ = 0;
          uStack_938 = 0;
          uStack_937 = 0;
          nonstd::optional_lite::
          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
          ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                      *)local_610,&(anim->rotations)._attrib);
          if (local_610[0] == true) {
            if (local_608[0x19] == '\x01') {
              local_858 = true;
            }
            if (local_608[0x18] == '\x01') {
              local_908._M_allocated_capacity = 0;
              local_908._M_local_buf[8] = '\0';
              local_908._9_7_ = 0;
              local_8f8 = 0;
              uStack_8f7 = 0;
              if (local_608[0x19] == '\0') {
                ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                operator=((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *
                          )&local_908,
                          (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *
                          )local_608);
                local_910 = &linb::any::
                             vtable_for_type<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>()
                             ::table;
                pvVar7 = (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                         operator_new(0x18);
                ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                vector(pvVar7,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                               *)&local_908);
                local_920.dynamic = pvVar7;
                linb::any::operator=((any *)&local_968,(any *)&local_920);
                if (local_910 != (undefined **)0x0) {
                  (*(code *)local_910[4])(&local_920);
                  local_910 = (undefined **)0x0;
                }
              }
              if ((void *)local_908._M_allocated_capacity != (void *)0x0) {
                operator_delete((void *)local_908._M_allocated_capacity,
                                CONCAT71(uStack_8f7,local_8f8) - local_908._0_8_);
              }
            }
            if (local_610[0] == false) {
LAB_0032997c:
              __assert_fail("has_value()",
                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                            ,0x591,
                            "value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf>>>::value() [T = tinyusdz::Animatable<std::vector<tinyusdz::value::quatf>>]"
                           );
            }
            if (local_5e8._dirty == true) {
              TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
              ::update(&local_5e8);
            }
            if (local_5e8._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_5e8._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              if (local_610[0] == false) goto LAB_0032997c;
              local_8e8._M_allocated_capacity = (size_type)anim;
              local_8e8._8_8_ = __return_storage_ptr__;
              if (local_5e8._dirty == true) {
                TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                ::update(&local_5e8);
              }
              local_8f8 = 0;
              uStack_8f7 = 0;
              local_8f0 = 0;
              local_908._M_allocated_capacity = 0;
              local_908._M_local_buf[8] = '\0';
              local_908._9_7_ = 0;
              if (local_5e8._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_5e8._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                lVar9 = 8;
                uVar8 = 0;
                do {
                  t = *(double *)
                       ((long)local_5e8._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start + -8 + lVar9);
                  __x = (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                        ((long)local_5e8._samples.
                               super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar9);
                  local_910 = &linb::any::
                               vtable_for_type<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>()
                               ::table;
                  pvVar7 = (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            *)operator_new(0x18);
                  ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                  vector(pvVar7,__x);
                  local_920.dynamic = pvVar7;
                  tinyusdz::value::TimeSamples::add_sample
                            ((TimeSamples *)&local_908,t,(Value *)&local_920);
                  if (local_910 != (undefined **)0x0) {
                    (*(code *)local_910[4])(&local_920);
                    local_910 = (undefined **)0x0;
                  }
                  uVar8 = uVar8 + 1;
                  lVar9 = lVar9 + 0x28;
                } while (uVar8 < (ulong)(((long)local_5e8._samples.
                                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_5e8._samples.
                                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                        -0x3333333333333333));
              }
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)(local_958 + 0x10),
                          (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&local_908);
              uStack_937._7_1_ = local_8f0;
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&local_908);
              __return_storage_ptr__ =
                   (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_8e8._8_8_;
              anim = (SkelAnimation *)local_8e8._M_allocated_capacity;
            }
            if (local_610[0] == false) goto LAB_0032997c;
            if (local_608[0x18] == '\0') {
              if (local_5e8._dirty == true) {
                TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                ::update(&local_5e8);
              }
              if (local_5e8._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_5e8._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start) goto LAB_003295d9;
            }
            Attribute::set_var((Attribute *)local_8b8,(PrimVar *)&local_968);
          }
LAB_003295d9:
          if (local_610[0] == true) {
            nonstd::optional_lite::detail::
            storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
            ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                              *)local_608);
          }
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)(local_958 + 0x10));
          if ((undefined **)local_958._0_8_ != (undefined **)0x0) {
            (**(code **)(local_958._0_8_ + 0x20))(&local_968);
            local_958._0_8_ = (undefined **)0x0;
          }
          AttrMetas::operator=(&AStack_818,&(anim->rotations)._metas);
          Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
          ::std::__cxx11::string::operator=((string *)out_prop,(string *)local_610);
          (out_prop->_attrib)._variability = local_608._24_4_;
          (out_prop->_attrib)._varying_authored = (bool)local_608[0x1c];
          ::std::__cxx11::string::operator=
                    ((string *)&(out_prop->_attrib)._type_name,(string *)&local_5e8);
          linb::any::operator=((any *)&(out_prop->_attrib)._var,&local_5c8);
          (out_prop->_attrib)._var._blocked = local_5b0;
          local_968.dynamic =
               (out_prop->_attrib)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_968._8_8_ =
               *(pointer *)
                ((long)&(out_prop->_attrib)._var._ts._samples.
                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ._M_impl.super__Vector_impl_data + 8);
          local_958._0_8_ =
               *(pointer *)
                ((long)&(out_prop->_attrib)._var._ts._samples.
                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ._M_impl.super__Vector_impl_data + 0x10);
          (out_prop->_attrib)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = local_5a8;
          *(pointer *)
           ((long)&(out_prop->_attrib)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data + 8) = local_5a0;
          *(pointer *)
           ((long)&(out_prop->_attrib)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data + 0x10) = local_598;
          local_5a8 = (pointer)0x0;
          local_5a0 = (pointer)0x0;
          local_598 = (pointer)0x0;
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&local_968);
          (out_prop->_attrib)._var._ts._dirty = local_590;
          local_968.dynamic =
               (out_prop->_attrib)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_968._8_8_ =
               (out_prop->_attrib)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_958._0_8_ =
               (out_prop->_attrib)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (out_prop->_attrib)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start = local_588;
          (out_prop->_attrib)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish = local_580;
          (out_prop->_attrib)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_578;
          local_588 = (pointer)0x0;
          local_580 = (pointer)0x0;
          local_578 = (pointer)0x0;
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_968);
          AttrMetas::operator=(&(out_prop->_attrib)._metas,&AStack_570);
          out_prop->_listOpQual = local_368;
          out_prop->_type = TStack_364;
          (out_prop->_rel).type = local_360;
          Path::operator=(&(out_prop->_rel).targetPath,&PStack_358);
          local_968.dynamic =
               (out_prop->_rel).targetPathVector.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_968._8_8_ =
               (out_prop->_rel).targetPathVector.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_958._0_8_ =
               (out_prop->_rel).targetPathVector.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (out_prop->_rel).targetPathVector.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start = local_288;
          (out_prop->_rel).targetPathVector.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish = local_280;
          (out_prop->_rel).targetPathVector.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_278;
          local_288 = (pointer)0x0;
          local_280 = (pointer)0x0;
          local_278 = (pointer)0x0;
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_968);
          (out_prop->_rel).listOpQual = local_270;
          AttrMetas::operator=(&(out_prop->_rel)._metas,&AStack_268);
          (out_prop->_rel)._varying_authored = local_60;
          ::std::__cxx11::string::operator=((string *)&out_prop->_prop_value_type_name,asStack_58);
          out_prop->_has_custom = local_38;
          Property::~Property((Property *)local_610);
          AttrMetas::~AttrMetas(&AStack_818);
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_850);
          if (local_860 != (vtable_type *)0x0) {
            (*local_860->destroy)(&local_870);
            local_860 = (vtable_type *)0x0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_890._M_p != &local_880) {
            operator_delete(local_890._M_p,
                            CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
            operator_delete((void *)local_8b8._0_8_,CONCAT71(local_8b8._17_7_,local_8b8[0x10]) + 1);
          }
        }
        else {
          iVar5 = ::std::__cxx11::string::compare((char *)prop_name);
          if (iVar5 == 0) {
            (anonymous_namespace)::
            ToProperty<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                      (&anim->scales,out_prop,err_01);
          }
          else {
            iVar5 = ::std::__cxx11::string::compare((char *)prop_name);
            if (iVar5 == 0) {
              (anonymous_namespace)::
              ToProperty<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                        (&anim->translations,out_prop,err_02);
            }
            else {
              cVar6 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                              *)&anim->props,prop_name);
              if ((_Rb_tree_header *)cVar6._M_node ==
                  &(anim->props)._M_t._M_impl.super__Rb_tree_header) {
                (__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value = true;
                (__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0.m_value = false;
                goto LAB_0032994a;
              }
              Property::operator=(out_prop,(Property *)(cVar6._M_node + 2));
            }
          }
        }
      }
    }
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = true;
LAB_0032994a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,
                    CONCAT71(local_8d8.field_2._M_allocated_capacity._1_7_,
                             local_8d8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const SkelAnimation &anim, const std::string &prop_name,
    Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  std::string err;

  TO_PROPERTY("blendShapes", anim.blendShapes)
  TO_PROPERTY("blendShapeWeights", anim.blendShapeWeights)
  TO_PROPERTY("joints", anim.joints)
  TO_PROPERTY("rotations", anim.rotations)
  TO_PROPERTY("scales", anim.scales)
  TO_PROPERTY("translations", anim.translations)

  {
    const auto it = anim.props.find(prop_name);
    if (it == anim.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }
  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());
  return true;
}